

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::AdvancedChangeSize::Run(AdvancedChangeSize *this)

{
  Vector<float,_4> *v;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint width;
  GLuint GVar5;
  GLint GVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ostream *poVar9;
  ulong uVar10;
  int iVar11;
  int i_1;
  GLsizei GVar12;
  long lVar13;
  GLint GVar14;
  bool *pbVar15;
  char *format;
  ulong uVar16;
  int iVar17;
  long lVar18;
  AdvancedChangeSize *pAVar19;
  CallLogWrapper *this_00;
  int i;
  bool bVar20;
  allocator_type local_249;
  GLint length_1;
  int local_240;
  GLint local_23c;
  GLint local_238;
  uint local_234;
  CallLogWrapper *local_230;
  AdvancedChangeSize *local_228;
  int local_21c;
  GLint length;
  undefined4 uStack_214;
  GLint attached_shaders;
  undefined4 uStack_1f4;
  GLint status;
  undefined4 uStack_1dc;
  GLenum type;
  char *glsl_fs;
  char *glsl_vs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> shaders;
  
  glsl_vs = 
  "#version 430 core\nout gl_PerVertex { vec4 gl_Position; };\nconst vec2 g_position[3] = { vec2(-1, -1), vec2(3, -1), vec2(-1, 3) };\nvoid main() { gl_Position = vec4(g_position[gl_VertexID], 0, 1); }"
  ;
  glsl_fs = 
  "#version 430 core\nlayout(location = 0) out vec4 g_color;\nlayout(binding = 0, rgba8) uniform image2D g_image[2];\nuniform ivec2 g_expected_size[2];\nuniform int g_0 = 0, g_1 = 1;\nvoid main() {\n  vec4 c = vec4(0, 1, 0, 1);\n  if (imageSize(g_image[g_0]).xy != g_expected_size[g_0]) c = vec4(1, 0, 0, 1);\n  if (imageSize(g_image[g_1]).yx != g_expected_size[g_1]) c = vec4(1, 0, 0, 1);\n  g_color = c;\n}"
  ;
  this_00 = &(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  GVar5 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b31,1,&glsl_vs);
  this->m_program[0] = GVar5;
  GVar5 = glu::CallLogWrapper::glCreateShaderProgramv(this_00,0x8b30,1,&glsl_fs);
  this->m_program[1] = GVar5;
  local_228 = this;
  for (lVar13 = 0; pAVar19 = local_228, lVar13 != 2; lVar13 = lVar13 + 1) {
    GVar5 = local_228->m_program[lVar13];
    if (GVar5 != 0) {
      glu::CallLogWrapper::glGetProgramiv(this_00,GVar5,0x8b82,&status);
      if (status == 0) {
        glu::CallLogWrapper::glGetProgramiv(this_00,GVar5,0x8b85,&attached_shaders);
        if (0 < (long)attached_shaders) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&shaders,(long)attached_shaders,(allocator_type *)&length);
          glu::CallLogWrapper::glGetAttachedShaders
                    (this_00,GVar5,attached_shaders,(GLsizei *)0x0,
                     shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_start);
          for (lVar18 = 0; lVar18 < attached_shaders; lVar18 = lVar18 + 1) {
            glu::CallLogWrapper::glGetShaderiv
                      (this_00,shaders.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar18],0x8b4f,
                       (GLint *)&type);
            if (type == 0x8b30) {
              format = "*** Fragment Shader ***\n";
            }
            else {
              format = "*** Vertex Shader ***\n";
              if (type != 0x8b31) {
                if (type == 0x8dd9) {
                  format = "*** Geometry Shader ***\n";
                }
                else if (type == 0x8e87) {
                  format = "*** Tessellation Evaluation Shader ***\n";
                }
                else if (type == 0x8e88) {
                  format = "*** Tessellation Control Shader ***\n";
                }
                else if (type == 0x91b9) {
                  format = "*** Compute Shader ***\n";
                }
                else {
                  format = "*** Unknown Shader ***\n";
                }
              }
            }
            anon_unknown_0::Output(format);
            glu::CallLogWrapper::glGetShaderiv
                      (this_00,shaders.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar18],0x8b88,&length_1);
            if (0 < (long)length_1) {
              std::vector<char,_std::allocator<char>_>::vector
                        ((vector<char,_std::allocator<char>_> *)&length,(long)length_1,&local_249);
              glu::CallLogWrapper::glGetShaderSource
                        (this_00,shaders.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar18],length_1,
                         (GLsizei *)0x0,(GLchar *)CONCAT44(uStack_214,length));
              anon_unknown_0::Output("%s\n",CONCAT44(uStack_214,length));
              std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                        ((_Vector_base<char,_std::allocator<char>_> *)&length);
            }
            glu::CallLogWrapper::glGetShaderiv
                      (this_00,shaders.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar18],0x8b84,&length_1);
            if (0 < (long)length_1) {
              std::vector<char,_std::allocator<char>_>::vector
                        ((vector<char,_std::allocator<char>_> *)&length,(long)length_1,&local_249);
              glu::CallLogWrapper::glGetShaderInfoLog
                        (this_00,shaders.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar18],length_1,
                         (GLsizei *)0x0,(GLchar *)CONCAT44(uStack_214,length));
              anon_unknown_0::Output("%s\n",CONCAT44(uStack_214,length));
              std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                        ((_Vector_base<char,_std::allocator<char>_> *)&length);
            }
          }
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        }
        glu::CallLogWrapper::glGetProgramiv(this_00,GVar5,0x8b84,&length);
        if (0 < (long)length) {
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&shaders,(long)length,
                     (allocator_type *)&type);
          glu::CallLogWrapper::glGetProgramInfoLog
                    (this_00,GVar5,length,(GLsizei *)0x0,
                     (GLchar *)
                     shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     .super__Vector_impl_data._M_start);
          anon_unknown_0::Output
                    ("%s\n",shaders.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    ((_Vector_base<char,_std::allocator<char>_> *)&shaders);
        }
      }
      if (status != 1) {
        return -1;
      }
    }
  }
  glu::CallLogWrapper::glUseProgramStages(this_00,local_228->m_pipeline,1,local_228->m_program[0]);
  glu::CallLogWrapper::glUseProgramStages(this_00,pAVar19->m_pipeline,2,pAVar19->m_program[1]);
  glu::CallLogWrapper::glBindVertexArray(this_00,pAVar19->m_vertex_array);
  glu::CallLogWrapper::glBindProgramPipeline(this_00,pAVar19->m_pipeline);
  _length_1 = 0x8000000020;
  for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,pAVar19->m_texture[lVar13]);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2601);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,0,0x8058,(&length_1)[lVar13],(&length_1)[lVar13],0,0x1908,0x1406,
               (void *)0x0);
    glu::CallLogWrapper::glBindImageTexture
              (this_00,(GLuint)lVar13,pAVar19->m_texture[lVar13],0,'\0',0,35000,0x8058);
  }
  uVar10 = 0x20;
  iVar7 = 0x80;
  local_230 = this_00;
  for (local_234 = 0; local_234 != 3; local_234 = local_234 + 1) {
    GVar5 = pAVar19->m_program[1];
    GVar6 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar5,"g_expected_size[0]");
    local_238 = (GLint)uVar10;
    glu::CallLogWrapper::glProgramUniform2i(this_00,GVar5,GVar6,local_238,local_238);
    GVar5 = pAVar19->m_program[1];
    GVar6 = glu::CallLogWrapper::glGetUniformLocation(this_00,GVar5,"g_expected_size[1]");
    local_23c = iVar7;
    glu::CallLogWrapper::glProgramUniform2i(this_00,GVar5,GVar6,iVar7,iVar7);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glDrawArrays(this_00,4,0,3);
    iVar7 = (*((pAVar19->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar7 = *(int *)CONCAT44(extraout_var,iVar7);
    iVar8 = (*((pAVar19->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
               &attached_shaders,(long)(iVar7 * *(int *)(CONCAT44(extraout_var_00,iVar8) + 4)),
               (allocator_type *)&shaders);
    iVar7 = (*((pAVar19->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    GVar12 = *(GLsizei *)CONCAT44(extraout_var_01,iVar7);
    iVar7 = (*((pAVar19->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    glu::CallLogWrapper::glReadPixels
              (local_230,0,0,GVar12,*(GLsizei *)(CONCAT44(extraout_var_02,iVar7) + 4),0x1907,0x1406,
               (void *)CONCAT44(uStack_1f4,attached_shaders));
    iVar7 = (*((pAVar19->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    width = *(uint *)CONCAT44(extraout_var_03,iVar7);
    iVar7 = (*((pAVar19->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    iVar7 = *(int *)(CONCAT44(extraout_var_04,iVar7) + 4);
    iVar8 = (*((pAVar19->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.m_context)->
              m_renderCtx->_vptr_RenderContext[4])();
    lVar13 = CONCAT44(extraout_var_05,iVar8);
    bVar1 = *(byte *)(lVar13 + 8);
    bVar2 = *(byte *)(lVar13 + 0xc);
    bVar3 = *(byte *)(lVar13 + 0x10);
    bVar4 = *(byte *)(lVar13 + 0x14);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&status,
               (long)(int)(iVar7 * width),(allocator_type *)&shaders);
    glu::CallLogWrapper::glReadPixels
              (local_230,0,0,width,iVar7,0x1908,0x1406,(void *)CONCAT44(uStack_1dc,status));
    iVar8 = 0;
    uVar10 = 0;
    if (0 < (int)width) {
      uVar10 = (ulong)width;
    }
    iVar11 = 0;
    if (0 < iVar7) {
      iVar11 = iVar7;
    }
    for (local_240 = 0; uVar16 = uVar10, pAVar19 = local_228, this_00 = local_230,
        GVar14 = local_238, GVar6 = local_23c, iVar17 = iVar8, local_21c = iVar7,
        local_240 != iVar11; local_240 = local_240 + 1) {
      while (bVar20 = uVar16 != 0, uVar16 = uVar16 - 1, bVar20) {
        v = (Vector<float,_4> *)(CONCAT44(uStack_1dc,status) + (long)iVar17 * 0x10);
        if ((((1.0 / (float)(1 << (bVar1 & 0x1f)) <
               ABS(*(float *)(CONCAT44(uStack_1dc,status) + (long)iVar17 * 0x10))) ||
             (1.0 / (float)(1 << (bVar2 & 0x1f)) < ABS(v->m_data[1] + -1.0))) ||
            (1.0 / (float)(1 << (bVar3 & 0x1f)) < ABS(v->m_data[2]))) ||
           (iVar17 = iVar17 + 1, 1.0 / (float)(1 << (bVar4 & 0x1f)) < ABS(v->m_data[3] + -1.0))) {
          tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&type,v);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaders);
          std::operator<<((ostream *)&shaders,"[");
          pAVar19 = local_228;
          this_00 = local_230;
          GVar14 = local_238;
          GVar6 = local_23c;
          for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
            poVar9 = (ostream *)std::ostream::operator<<(&shaders,(float)(&type)[lVar13]);
            pbVar15 = (bool *)0x190699d;
            if (lVar13 == 3) {
              pbVar15 = glcts::fixed_sample_locations_values + 1;
            }
            std::operator<<(poVar9,pbVar15);
          }
          std::operator<<((ostream *)&shaders,"]");
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaders);
          anon_unknown_0::Output("First bad color: %s.\n",CONCAT44(uStack_214,length));
          std::__cxx11::string::~string((string *)&length);
          iVar11 = local_240;
          goto LAB_00a9aa5a;
        }
      }
      iVar8 = iVar8 + width;
    }
LAB_00a9aa5a:
    local_240 = iVar11;
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              ((_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &status);
    std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~_Vector_base
              ((_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
               &attached_shaders);
    if (local_240 < local_21c) break;
    uVar10 = (long)GVar14 / 2 & 0xffffffff;
    iVar7 = GVar6 / 2;
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,pAVar19->m_texture[0]);
    GVar12 = (GLsizei)((long)GVar14 / 2);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,0,0x8058,GVar12,GVar12,0,0x1908,0x1406,(void *)0x0);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,pAVar19->m_texture[1]);
    glu::CallLogWrapper::glTexImage2D
              (this_00,0xde1,0,0x8058,iVar7,iVar7,0,0x1908,0x1406,(void *)0x0);
  }
  return -(ulong)(local_234 < 3);
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs = "#version 430 core" NL "out gl_PerVertex { vec4 gl_Position; };" NL
									"const vec2 g_position[3] = { vec2(-1, -1), vec2(3, -1), vec2(-1, 3) };" NL
									"void main() { gl_Position = vec4(g_position[gl_VertexID], 0, 1); }";
		const char* const glsl_fs =
			"#version 430 core" NL "layout(location = 0) out vec4 g_color;" NL
			"layout(binding = 0, rgba8) uniform image2D g_image[2];" NL "uniform ivec2 g_expected_size[2];" NL
			"uniform int g_0 = 0, g_1 = 1;" NL "void main() {" NL "  vec4 c = vec4(0, 1, 0, 1);" NL
			"  if (imageSize(g_image[g_0]).xy != g_expected_size[g_0]) c = vec4(1, 0, 0, 1);" NL
			"  if (imageSize(g_image[g_1]).yx != g_expected_size[g_1]) c = vec4(1, 0, 0, 1);" NL "  g_color = c;" NL
			"}";
		m_program[0] = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
		m_program[1] = glCreateShaderProgramv(GL_FRAGMENT_SHADER, 1, &glsl_fs);
		for (int i = 0; i < 2; ++i)
			if (!CheckProgram(m_program[i]))
				return ERROR;

		glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_program[0]);
		glUseProgramStages(m_pipeline, GL_FRAGMENT_SHADER_BIT, m_program[1]);

		glBindVertexArray(m_vertex_array);
		glBindProgramPipeline(m_pipeline);

		int size[2] = { 32, 128 };
		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, m_texture[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, size[i], size[i], 0, GL_RGBA, GL_FLOAT, NULL);
			glBindImageTexture(i, m_texture[i], 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA8);
		}

		for (int i = 0; i < 3; ++i)
		{
			glProgramUniform2i(m_program[1], glGetUniformLocation(m_program[1], "g_expected_size[0]"), size[0],
							   size[0]);
			glProgramUniform2i(m_program[1], glGetUniformLocation(m_program[1], "g_expected_size[1]"), size[1],
							   size[1]);
			glClear(GL_COLOR_BUFFER_BIT);
			glDrawArrays(GL_TRIANGLES, 0, 3);

			{
				bool			  status = true;
				std::vector<vec3> fb(getWindowWidth() * getWindowHeight());
				glReadPixels(0, 0, getWindowWidth(), getWindowHeight(), GL_RGB, GL_FLOAT, &fb[0][0]);
				if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 1, 0, 1)))
					status = false;
				if (!status)
					return ERROR;
			}

			size[0] /= 2;
			size[1] /= 2;

			glBindTexture(GL_TEXTURE_2D, m_texture[0]);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, size[0], size[0], 0, GL_RGBA, GL_FLOAT, NULL);
			glBindTexture(GL_TEXTURE_2D, m_texture[1]);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, size[1], size[1], 0, GL_RGBA, GL_FLOAT, NULL);
		}
		return NO_ERROR;
	}